

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

bool __thiscall
ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_>::QuickSort
          (ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_> *this,
          _func_int_ON_ClassArray<ON_SubDEdgePtr>_ptr_ON_ClassArray<ON_SubDEdgePtr>_ptr *compar)

{
  int iVar1;
  
  if (this->m_a != (ON_ClassArray<ON_SubDEdgePtr> *)0x0) {
    iVar1 = this->m_count;
    if (compar != (_func_int_ON_ClassArray<ON_SubDEdgePtr>_ptr_ON_ClassArray<ON_SubDEdgePtr>_ptr *)
                  0x0 && 0 < (long)iVar1) {
      if (iVar1 < 2) {
        return true;
      }
      ON_qsort(this->m_a,(long)iVar1,0x18,(_func_int_void_ptr_void_ptr *)compar);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ClassArray<T>::QuickSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar ) 
  {
    if ( m_count > 1 )
      ON_qsort( m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    rc = true;
  }
  return rc;
}